

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_member_name_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> *this_00;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  Vector<Decoration> *this_01;
  size_t sVar5;
  ulong uVar6;
  Decoration *pDVar7;
  uint in_ECX;
  undefined4 in_register_00000014;
  byte local_31;
  Vector<Decoration> *memb;
  long lStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  lStack_20 = CONCAT44(in_register_00000014,index);
  this_00 = (TypedID<(spirv_cross::Types)1> *)(lStack_20 + 0x110);
  memb._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&memb,0);
  bVar1 = TypedID<(spirv_cross::Types)1>::operator!=
                    (this_00,(TypedID<(spirv_cross::Types)1> *)&memb);
  local_31 = 0;
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 0x110));
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)type,uVar2,SPIRVCrossDecorationBufferBlockRepacked);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) == 0) {
    pmVar4 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                           *)&(type->image).depth,(key_type *)(lStack_20 + 8));
    this_01 = &pmVar4->members;
    uVar6 = (ulong)memb._4_4_;
    sVar5 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&this_01->super_VectorView<spirv_cross::Meta::Decoration>);
    if (uVar6 < sVar5) {
      VectorView<spirv_cross::Meta::Decoration>::operator[]
                (&this_01->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)memb._4_4_);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pDVar7 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&this_01->super_VectorView<spirv_cross::Meta::Decoration>,
                            (ulong)memb._4_4_);
        ::std::__cxx11::string::string((string *)this,(string *)pDVar7);
        return this;
      }
    }
    join<char_const(&)[3],unsigned_int&>
              ((spirv_cross *)this,(char (*) [3])0x4f1638,(uint *)((long)&memb + 4));
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 0x110));
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar2);
    to_member_name_abi_cxx11_(this,type,(uint32_t)pSVar3);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_member_name(const SPIRType &type, uint32_t index)
{
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
	{
		return to_member_name(get<SPIRType>(type.type_alias), index);
	}

	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
		return memb[index].alias;
	else
		return join("_m", index);
}